

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_data.cpp
# Opt level: O2

Error * ot::commissioner::Ipv6PrefixFromString
                  (Error *__return_storage_ptr__,ByteArray *aPrefix,string *aStr)

{
  ErrorCode EVar1;
  long lVar2;
  ulonglong uVar3;
  Error *pEVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string local_e0;
  ByteArray *local_c0;
  Address addr;
  undefined1 local_98 [8];
  _Alloc_hider _Stack_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  code *local_70;
  undefined1 local_60 [40];
  char *endPtr;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = std::__cxx11::string::find((char)aStr,0x2f);
  if (lVar2 == -1) {
    local_98._0_4_ = string_type;
    _Stack_90._M_p = "{} is not a valid IPv6 prefix";
    local_88 = 0x1d;
    local_80._M_allocated_capacity = 0x100000000;
    local_70 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar6 = "{} is not a valid IPv6 prefix";
    local_80._8_8_ = (format_string_checker<char> *)local_98;
    while (pcVar5 = pcVar6, pcVar5 != "") {
      pcVar6 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar5,"",(format_string_checker<char> *)local_98);
      }
    }
    local_98 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
    _Stack_90._M_p = (pointer)aStr->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1d;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_98;
    ::fmt::v10::vformat_abi_cxx11_(&local_e0,(v10 *)"{} is not a valid IPv6 prefix",fmt,args);
    local_60._0_4_ = kInvalidArgs;
    std::__cxx11::string::string((string *)(local_60 + 8),(string *)&local_e0);
  }
  else {
    endPtr = (char *)0x0;
    local_c0 = aPrefix;
    uVar3 = strtoull((aStr->_M_dataplus)._M_p + lVar2 + 1,&endPtr,0);
    if ((endPtr == (char *)0x0) || (endPtr <= (aStr->_M_dataplus)._M_p + lVar2 + 1)) {
      local_98._0_4_ = string_type;
      _Stack_90._M_p = "{} is not a valid IPv6 prefix";
      local_88 = 0x1d;
      local_80._M_allocated_capacity = 0x100000000;
      local_70 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar6 = "{} is not a valid IPv6 prefix";
      local_80._8_8_ = (format_string_checker<char> *)local_98;
      while (pcVar5 = pcVar6, pcVar5 != "") {
        pcVar6 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar5,"",(format_string_checker<char> *)local_98);
        }
      }
      local_98 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
      _Stack_90._M_p = (pointer)aStr->_M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1d;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_98;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e0,(v10 *)"{} is not a valid IPv6 prefix",fmt_00,args_00);
      local_60._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_60 + 8),(string *)&local_e0);
    }
    else if (uVar3 < 0x81) {
      std::__cxx11::string::substr((ulong)local_60,(ulong)aStr);
      Address::Set((Error *)local_98,&addr,(string *)local_60);
      pEVar4 = Error::operator=(__return_storage_ptr__,(Error *)local_98);
      EVar1 = pEVar4->mCode;
      std::__cxx11::string::~string((string *)&_Stack_90);
      std::__cxx11::string::~string((string *)local_60);
      if (EVar1 != kNone) goto LAB_001c9929;
      if ((long)addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)addr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x10) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(local_c0,&addr.mBytes)
        ;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_c0,uVar3 >> 3);
        goto LAB_001c9929;
      }
      local_98._0_4_ = string_type;
      _Stack_90._M_p = "{} is not a valid IPv6 prefix";
      local_88 = 0x1d;
      local_80._M_allocated_capacity = 0x100000000;
      local_70 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar6 = "{} is not a valid IPv6 prefix";
      local_80._8_8_ = (format_string_checker<char> *)local_98;
      while (pcVar5 = pcVar6, pcVar5 != "") {
        pcVar6 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar5,"",(format_string_checker<char> *)local_98);
        }
      }
      local_98 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
      _Stack_90._M_p = (pointer)aStr->_M_string_length;
      fmt_02.size_ = 0xd;
      fmt_02.data_ = (char *)0x1d;
      args_02.field_1.args_ = in_R9.args_;
      args_02.desc_ = (unsigned_long_long)local_98;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e0,(v10 *)"{} is not a valid IPv6 prefix",fmt_02,args_02);
      local_60._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_60 + 8),(string *)&local_e0);
    }
    else {
      local_98._0_4_ = string_type;
      _Stack_90._M_p = "{} is not a valid IPv6 prefix";
      local_88 = 0x1d;
      local_80._M_allocated_capacity = 0x100000000;
      local_70 = ::fmt::v10::detail::
                 parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar6 = "{} is not a valid IPv6 prefix";
      local_80._8_8_ = (format_string_checker<char> *)local_98;
      while (pcVar5 = pcVar6, pcVar5 != "") {
        pcVar6 = pcVar5 + 1;
        if (*pcVar5 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar5 + 2;
        }
        else if (*pcVar5 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar5,"",(format_string_checker<char> *)local_98);
        }
      }
      local_98 = (undefined1  [8])(aStr->_M_dataplus)._M_p;
      _Stack_90._M_p = (pointer)aStr->_M_string_length;
      fmt_01.size_ = 0xd;
      fmt_01.data_ = (char *)0x1d;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_98;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e0,(v10 *)"{} is not a valid IPv6 prefix",fmt_01,args_01);
      local_60._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_60 + 8),(string *)&local_e0);
    }
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 8));
  std::__cxx11::string::~string((string *)&local_e0);
LAB_001c9929:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr);
  return __return_storage_ptr__;
}

Assistant:

Error Ipv6PrefixFromString(ByteArray &aPrefix, const std::string &aStr)
{
    Error   error;
    size_t  slash;
    size_t  prefixLength;
    Address addr;

    slash = aStr.find('/');
    VerifyOrExit(slash != std::string::npos, error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));

    {
        char *endPtr = nullptr;
        prefixLength = strtoull(&aStr[slash + 1], &endPtr, 0);
        VerifyOrExit(endPtr != nullptr && endPtr > &aStr[slash + 1],
                     error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));
        VerifyOrExit(prefixLength <= 128, error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));
        prefixLength /= 8;
    }

    SuccessOrExit(error = addr.Set(aStr.substr(0, slash)));
    VerifyOrExit(addr.IsIpv6(), error = ERROR_INVALID_ARGS("{} is not a valid IPv6 prefix", aStr));

    aPrefix = addr.GetRaw();
    aPrefix.resize(prefixLength);

exit:
    return error;
}